

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = ctxt->spaceNr;
  iVar1 = ctxt->spaceMax;
  if (iVar2 < iVar1) {
    piVar3 = ctxt->spaceTab;
  }
  else {
    ctxt->spaceMax = iVar1 * 2;
    piVar3 = (int *)(*xmlRealloc)(ctxt->spaceTab,(long)iVar1 << 3);
    if (piVar3 == (int *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      iVar2 = ctxt->spaceMax;
      ctxt->spaceMax = iVar2 / 2;
      return iVar2;
    }
    ctxt->spaceTab = piVar3;
    iVar2 = ctxt->spaceNr;
  }
  piVar3[iVar2] = val;
  ctxt->space = piVar3 + ctxt->spaceNr;
  iVar2 = ctxt->spaceNr + 1;
  ctxt->spaceNr = iVar2;
  return iVar2;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;

	ctxt->spaceMax *= 2;
        tmp = (int *) xmlRealloc(ctxt->spaceTab,
	                         ctxt->spaceMax * sizeof(ctxt->spaceTab[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    ctxt->spaceMax /=2;
	    return(-1);
	}
	ctxt->spaceTab = tmp;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}